

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_process_raw(ps_decoder_t *ps,int16 *data,size_t n_samples,int no_search,int full_utt)

{
  int iVar1;
  int iVar2;
  size_t local_40;
  int16 *local_38;
  
  local_40 = n_samples;
  local_38 = data;
  if (ps->acmod->state == '\0') {
    iVar2 = 0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x4ce,"Failed to process data, utterance is not started. Use start_utt to start it\n");
  }
  else {
    if (no_search != 0) {
      acmod_set_grow(ps->acmod,1);
    }
    if (n_samples == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      do {
        iVar1 = acmod_process_raw(ps->acmod,&local_38,&local_40,full_utt);
        if (iVar1 < 0 || no_search != 0) {
          if (iVar1 < 0) {
            return iVar1;
          }
        }
        else {
          iVar1 = ps_search_forward(ps);
          if (iVar1 < 0) {
            return iVar1;
          }
          iVar2 = iVar2 + iVar1;
        }
      } while (local_40 != 0);
    }
  }
  return iVar2;
}

Assistant:

int
ps_process_raw(ps_decoder_t *ps,
               int16 const *data,
               size_t n_samples,
               int no_search,
               int full_utt)
{
    int n_searchfr = 0;

    if (ps->acmod->state == ACMOD_IDLE) {
	E_ERROR("Failed to process data, utterance is not started. Use start_utt to start it\n");
	return 0;
    }

    if (no_search)
        acmod_set_grow(ps->acmod, TRUE);

    while (n_samples) {
        int nfr;

        /* Process some data into features. */
        if ((nfr = acmod_process_raw(ps->acmod, &data,
                                     &n_samples, full_utt)) < 0)
            return nfr;

        /* Score and search as much data as possible */
        if (no_search)
            continue;
        if ((nfr = ps_search_forward(ps)) < 0)
            return nfr;
        n_searchfr += nfr;
    }

    return n_searchfr;
}